

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::checkInput(Amr *this)

{
  pointer pGVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ostream *os_;
  uint uVar6;
  int i_1;
  int lev;
  long lVar7;
  int i_2;
  int idim;
  long lVar8;
  long lVar9;
  Box *this_00;
  int i;
  long lVar10;
  Print PStack_1b8;
  
  if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level < 0) {
    Error_host("checkInput: max_level not set");
  }
  lVar10 = 0;
  do {
    uVar5 = (ulong)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
    if ((long)uVar5 < lVar10) {
      for (lev = 0; lev < (int)uVar5; lev = lev + 1) {
        iVar4 = AmrMesh::MaxRefRatio((AmrMesh *)this,lev);
        if (iVar4 < 2) {
          Error_host("Amr::checkInput: bad ref_ratios");
        }
        uVar5 = (ulong)(uint)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      }
      pGVar1 = (this->super_AmrCore).super_AmrMesh.geom.
               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = &pGVar1->domain;
      bVar3 = Box::ok(this_00);
      if (!bVar3) {
        Error_host("level 0 domain bad or not set");
      }
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        if (((*(int *)((long)&(pGVar1->domain).bigend + lVar10 * 4) -
             (this_00->smallend).vect[lVar10]) + 1) %
            ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start)->vect[lVar10] != 0) {
          Error_host("domain size not divisible by blocking_factor");
        }
      }
      lVar8 = 0;
      for (lVar10 = 0; uVar5 = (ulong)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level,
          lVar10 <= (long)uVar5; lVar10 = lVar10 + 1) {
        for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
          if ((*(byte *)((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_grid_size.
                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                _M_impl.super__Vector_impl_data._M_start)->vect + lVar9 * 4 + lVar8)
              & 1) != 0) {
            Error_host("max_grid_size is not even");
          }
        }
        lVar8 = lVar8 + 0xc;
      }
      lVar8 = 0;
      for (lVar10 = 0; lVar10 <= (int)uVar5; lVar10 = lVar10 + 1) {
        lVar9 = 3;
        lVar7 = lVar8;
        while (bVar3 = lVar9 != 0, lVar9 = lVar9 + -1, bVar3) {
          if (*(int *)((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_grid_size.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar7) %
              *(int *)((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar7) != 0) {
            Error_host("max_grid_size not divisible by blocking_factor");
          }
          lVar7 = lVar7 + 4;
        }
        uVar5 = (ulong)(uint)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
        lVar8 = lVar8 + 0xc;
      }
      bVar3 = RealBox::ok(&((this->super_AmrCore).super_AmrMesh.geom.
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_start)->prob_domain);
      if (!bVar3) {
        Error_host("Amr::checkInput: bad physical problem size");
      }
      if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
        os_ = OutStream();
        Print::Print(&PStack_1b8,os_);
        std::operator<<((ostream *)&PStack_1b8.ss,"Successfully read inputs file ... ");
        std::operator<<((ostream *)&PStack_1b8.ss,'\n');
        Print::~Print(&PStack_1b8);
      }
      return;
    }
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      uVar2 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10].vect[lVar8];
      do {
        uVar6 = uVar2;
        if ((int)uVar6 < 1) break;
        uVar2 = uVar6 >> 1;
      } while ((uVar6 & 1) == 0);
      if (uVar6 != 1) {
        Error_host("Amr::checkInput: blocking_factor not power of 2");
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void
Amr::checkInput ()
{
    if (max_level < 0) {
        amrex::Error("checkInput: max_level not set");
    }
    //
    // Check that blocking_factor is a power of 2.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            int k = blocking_factor[i][idim];
            while ( k > 0 && (k%2 == 0) ) {
                k /= 2;
            }
            if (k != 1) {
                amrex::Error("Amr::checkInput: blocking_factor not power of 2");
            }
        }
    }
    //
    // Check level dependent values.
    //
    for (int i = 0; i < max_level; i++)
    {
        if (MaxRefRatio(i) < 2) {
            amrex::Error("Amr::checkInput: bad ref_ratios");
        }
    }
    const Box& domain = Geom(0).Domain();
    if (!domain.ok()) {
        amrex::Error("level 0 domain bad or not set");
    }
    //
    // Check that domain size is a multiple of blocking_factor[0].
    //
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        int len = domain.length(i);
        if (len%blocking_factor[0][i] != 0) {
            amrex::Error("domain size not divisible by blocking_factor");
        }
    }
    //
    // Check that max_grid_size is even.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (max_grid_size[i][idim]%2 != 0) {
                amrex::Error("max_grid_size is not even");
            }
        }
    }

    //
    // Check that max_grid_size is a multiple of blocking_factor at every level.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (max_grid_size[i][idim]%blocking_factor[i][idim] != 0) {
                amrex::Error("max_grid_size not divisible by blocking_factor");
            }
        }
    }

    if( ! Geom(0).ProbDomain().ok()) {
        amrex::Error("Amr::checkInput: bad physical problem size");
    }

    if(verbose > 0) {
        amrex::Print() << "Successfully read inputs file ... " << '\n';
    }
}